

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O3

pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> __thiscall
HandleInfo<XrSpaceUserFB_T_*>::getWithInstanceInfo
          (HandleInfo<XrSpaceUserFB_T_*> *this,XrSpaceUserFB_T *handle)

{
  GenValidUsageXrHandleInfo *pGVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  iterator iVar3;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  UniqueLock lock;
  string local_48;
  XrSpaceUserFB_T *local_28;
  unique_lock<std::mutex> local_20;
  
  local_28 = handle;
  if (handle == (XrSpaceUserFB_T *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Null handle passed to HandleInfoBase::getWithInstanceInfo()","")
    ;
    reportInternalError(&local_48);
  }
  local_20._M_device =
       &(this->super_HandleInfoBase<XrSpaceUserFB_T_*,_GenValidUsageXrHandleInfo>).dispatch_mutex_;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  iVar3 = std::
          _Hashtable<XrSpaceUserFB_T_*,_std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSpaceUserFB_T_*>,_std::hash<XrSpaceUserFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<XrSpaceUserFB_T_*,_std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSpaceUserFB_T_*>,_std::hash<XrSpaceUserFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pGVar1 = *(GenValidUsageXrHandleInfo **)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<XrSpaceUserFB_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
                     ._M_cur + 0x10);
    pGVar2 = pGVar1->instance_info;
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
    pVar4.second = pGVar2;
    pVar4.first = pGVar1;
    return pVar4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted","");
  reportInternalError(&local_48);
}

Assistant:

inline std::pair<GenValidUsageXrHandleInfo *, GenValidUsageXrInstanceInfo *> HandleInfo<HandleType>::getWithInstanceInfo(
    HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::getWithInstanceInfo()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(this->dispatch_mutex_);
    auto entry_returned = this->info_map_.find(handle);
    if (entry_returned == this->info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::getWithInstanceInfo() not inserted");
    }
    GenValidUsageXrHandleInfo *info = entry_returned->second.get();
    GenValidUsageXrInstanceInfo *instance_info = info->instance_info;
    return {info, instance_info};
}